

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O2

JavascriptError *
Js::JavascriptError::CreateFromCompileScriptException
          (ScriptContext *scriptContext,CompileScriptException *cse,WCHAR *sourceUrl)

{
  char16 *content;
  byte bVar1;
  JavascriptError *instance;
  JavascriptString *pJVar2;
  Var pvVar3;
  
  instance = MapParseError(scriptContext,(cse->super_ScriptException).ei.scode);
  content = (cse->super_ScriptException).ei.bstrDescription;
  if (content != (char16 *)0x0) {
    pJVar2 = JavascriptString::NewCopySz(content,scriptContext);
    JavascriptOperators::OP_SetProperty
              (instance,0x102,pJVar2,scriptContext,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
  }
  bVar1 = cse->hasLineNumberInfo;
  if ((bool)bVar1 == true) {
    pvVar3 = JavascriptNumber::ToVar((double)cse->line);
    JavascriptOperators::OP_SetProperty
              (instance,0xf7,pvVar3,scriptContext,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
    bVar1 = cse->hasLineNumberInfo;
  }
  if ((bVar1 & 1) != 0) {
    pvVar3 = JavascriptNumber::ToVar
                       ((double)((cse->super_ScriptException).ichMin - cse->ichMinLine));
    JavascriptOperators::OP_SetProperty
              (instance,0x2d2,pvVar3,scriptContext,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
    bVar1 = cse->hasLineNumberInfo;
  }
  if ((bVar1 & 1) != 0) {
    pvVar3 = JavascriptNumber::ToVar
                       ((double)((cse->super_ScriptException).ichLim -
                                (cse->super_ScriptException).ichMin));
    JavascriptOperators::OP_SetProperty
              (instance,0xd1,pvVar3,scriptContext,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
  }
  if (cse->bstrLine != (char16 *)0x0) {
    pJVar2 = JavascriptString::NewCopySz(cse->bstrLine,scriptContext);
    JavascriptOperators::OP_SetProperty
              (instance,0x153,pJVar2,scriptContext,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
  }
  if (sourceUrl != (WCHAR *)0x0) {
    pJVar2 = JavascriptString::NewCopySz(sourceUrl,scriptContext);
    JavascriptOperators::OP_SetProperty
              (instance,0x2d3,pJVar2,scriptContext,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
  }
  return instance;
}

Assistant:

JavascriptError* JavascriptError::CreateFromCompileScriptException(ScriptContext* scriptContext, CompileScriptException* cse, const WCHAR * sourceUrl)
    {
        HRESULT hr = cse->ei.scode;
        Js::JavascriptError * error = Js::JavascriptError::MapParseError(scriptContext, hr);
        Var value;

        if (cse->ei.bstrDescription)
        {
            value = JavascriptString::NewCopySz(cse->ei.bstrDescription, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::message, value, scriptContext);
        }

        if (cse->hasLineNumberInfo)
        {
            value = JavascriptNumber::New(cse->line, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::line, value, scriptContext);
        }

        if (cse->hasLineNumberInfo)
        {
            value = JavascriptNumber::New(cse->ichMin - cse->ichMinLine, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::column, value, scriptContext);
        }

        if (cse->hasLineNumberInfo)
        {
            value = JavascriptNumber::New(cse->ichLim - cse->ichMin, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::length, value, scriptContext);
        }

        if (cse->bstrLine != nullptr)
        {
            value = JavascriptString::NewCopySz(cse->bstrLine, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::source, value, scriptContext);
        }

        if (sourceUrl != nullptr)
        {
            value = JavascriptString::NewCopySz(sourceUrl, scriptContext);
            JavascriptOperators::OP_SetProperty(error, PropertyIds::url, value, scriptContext);
        }

        return error;
    }